

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall duckdb::TaskScheduler::ExecuteForever(TaskScheduler *this,atomic<bool> *marker)

{
  unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true> *this_00;
  __int_type_conflict _Var1;
  bool bVar2;
  __pid_t _Var3;
  uint uVar4;
  pointer pCVar5;
  unsigned_long uVar6;
  idx_t iVar7;
  Task *pTVar8;
  ProducerToken *token;
  void *__stat_loc;
  shared_ptr<duckdb::Task,_true> task;
  optional_idx decay_delay;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  optional_idx local_38;
  
  token = (ProducerToken *)marker;
  local_58._24_8_ = DBConfig::GetConfig(this->db);
  local_68._0_8_ = (TaskScheduler *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->queue;
  do {
    if (((marker->_M_base)._M_i & 1U) == 0) {
      bVar2 = Allocator::SupportsFlush();
      if (bVar2) {
        _Var1 = (this->allocator_background_threads)._M_base._M_i;
        uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                          ((this->requested_thread_count).super___atomic_base<int>._M_i);
        Allocator::ThreadFlush((bool)(_Var1 & 1),0,uVar6);
        Allocator::ThreadIdle();
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      return;
    }
    bVar2 = Allocator::SupportsFlush();
    if (bVar2) {
      pCVar5 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
               ::operator->(this_00);
      _Var3 = duckdb_moodycamel::LightweightSemaphore::wait(&pCVar5->semaphore,(void *)0x7a120);
      if ((char)_Var3 == '\0') {
        _Var1 = (this->allocator_background_threads)._M_base._M_i;
        __stat_loc = (void *)(this->allocator_flush_threshold).super___atomic_base<unsigned_long>.
                             _M_i;
        uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                          ((this->requested_thread_count).super___atomic_base<int>._M_i);
        Allocator::ThreadFlush((bool)(_Var1 & 1),(idx_t)__stat_loc,uVar6);
        local_38 = Allocator::DecayDelay();
        if (local_38.index != 0xffffffffffffffff) {
          pCVar5 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                   ::operator->(this_00);
          iVar7 = optional_idx::GetIndex(&local_38);
          __stat_loc = (void *)(iVar7 * 1000000 + -500000);
          _Var3 = duckdb_moodycamel::LightweightSemaphore::wait(&pCVar5->semaphore,__stat_loc);
          if ((char)_Var3 != '\0') goto LAB_014a9941;
          Allocator::ThreadIdle();
        }
        pCVar5 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                 ::operator->(this_00);
        duckdb_moodycamel::LightweightSemaphore::wait(&pCVar5->semaphore,__stat_loc);
      }
    }
    else {
      pCVar5 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
               ::operator->(this_00);
      duckdb_moodycamel::LightweightSemaphore::wait(&pCVar5->semaphore,token);
    }
LAB_014a9941:
    pCVar5 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
             ::operator->(this_00);
    token = (ProducerToken *)local_68;
    bVar2 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_dequeue<duckdb::shared_ptr<duckdb::Task,true>>
                      ((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                        *)pCVar5,(shared_ptr<duckdb::Task,_true> *)local_68);
    if (bVar2) {
      bVar2 = *(bool *)((long)&((__pthread_internal_list *)(local_58._24_8_ + 0x570))->__prev + 1);
      pTVar8 = shared_ptr<duckdb::Task,_true>::operator->
                         ((shared_ptr<duckdb::Task,_true> *)local_68);
      token = (ProducerToken *)(ulong)bVar2;
      uVar4 = (*pTVar8->_vptr_Task[2])(pTVar8);
      switch(uVar4 & 0xff) {
      case 1:
        pTVar8 = shared_ptr<duckdb::Task,_true>::operator->
                           ((shared_ptr<duckdb::Task,_true> *)local_68);
        token = optional_ptr<duckdb::ProducerToken,_true>::operator*(&pTVar8->token);
        pCVar5 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                 ::operator->(this_00);
        local_58._0_8_ = local_68._0_8_;
        local_58._8_8_ = local_68._8_8_;
        local_68._0_8_ = (TaskScheduler *)0x0;
        local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ConcurrentQueue::Enqueue(pCVar5,token,(shared_ptr<duckdb::Task,_true> *)local_58);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
        break;
      case 3:
        pTVar8 = shared_ptr<duckdb::Task,_true>::operator->
                           ((shared_ptr<duckdb::Task,_true> *)local_68);
        (*pTVar8->_vptr_Task[3])(pTVar8);
      case 0:
      case 2:
        ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)local_68);
      }
    }
  } while( true );
}

Assistant:

void TaskScheduler::ExecuteForever(atomic<bool> *marker) {
#ifndef DUCKDB_NO_THREADS
	static constexpr const int64_t INITIAL_FLUSH_WAIT = 500000; // initial wait time of 0.5s (in mus) before flushing

	auto &config = DBConfig::GetConfig(db);
	shared_ptr<Task> task;
	// loop until the marker is set to false
	while (*marker) {
		if (!Allocator::SupportsFlush()) {
			// allocator can't flush, just start an untimed wait
			queue->semaphore.wait();
		} else if (!queue->semaphore.wait(INITIAL_FLUSH_WAIT)) {
			// allocator can flush, we flush this threads outstanding allocations after it was idle for 0.5s
			Allocator::ThreadFlush(allocator_background_threads, allocator_flush_threshold,
			                       NumericCast<idx_t>(requested_thread_count.load()));
			auto decay_delay = Allocator::DecayDelay();
			if (!decay_delay.IsValid()) {
				// no decay delay specified - just wait
				queue->semaphore.wait();
			} else {
				if (!queue->semaphore.wait(UnsafeNumericCast<int64_t>(decay_delay.GetIndex()) * 1000000 -
				                           INITIAL_FLUSH_WAIT)) {
					// in total, the thread was idle for the entire decay delay (note: seconds converted to mus)
					// mark it as idle and start an untimed wait
					Allocator::ThreadIdle();
					queue->semaphore.wait();
				}
			}
		}
		if (queue->q.try_dequeue(task)) {
			auto process_mode = config.options.scheduler_process_partial ? TaskExecutionMode::PROCESS_PARTIAL
			                                                             : TaskExecutionMode::PROCESS_ALL;
			auto execute_result = task->Execute(process_mode);

			switch (execute_result) {
			case TaskExecutionResult::TASK_FINISHED:
			case TaskExecutionResult::TASK_ERROR:
				task.reset();
				break;
			case TaskExecutionResult::TASK_NOT_FINISHED: {
				// task is not finished - reschedule immediately
				auto &token = *task->token;
				queue->Enqueue(token, std::move(task));
				break;
			}
			case TaskExecutionResult::TASK_BLOCKED:
				task->Deschedule();
				task.reset();
				break;
			}
		}
	}
	// this thread will exit, flush all of its outstanding allocations
	if (Allocator::SupportsFlush()) {
		Allocator::ThreadFlush(allocator_background_threads, 0, NumericCast<idx_t>(requested_thread_count.load()));
		Allocator::ThreadIdle();
	}
#else
	throw NotImplementedException("DuckDB was compiled without threads! Background thread loop is not allowed.");
#endif
}